

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this,LogFormat *logFormat)

{
  pointer pcVar1;
  pointer pcVar2;
  
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_001832c0;
  this->m_level = logFormat->m_level;
  (this->m_userFormat)._M_dataplus._M_p = (pointer)&(this->m_userFormat).field_2;
  pcVar1 = (logFormat->m_userFormat)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_userFormat,pcVar1,
             pcVar1 + (logFormat->m_userFormat)._M_string_length);
  (this->m_format)._M_dataplus._M_p = (pointer)&(this->m_format).field_2;
  pcVar1 = (logFormat->m_format)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_format,pcVar1,pcVar1 + (logFormat->m_format)._M_string_length);
  (this->m_dateTimeFormat)._M_dataplus._M_p = (pointer)&(this->m_dateTimeFormat).field_2;
  pcVar2 = (logFormat->m_dateTimeFormat)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_dateTimeFormat,pcVar2,
             pcVar2 + (logFormat->m_dateTimeFormat)._M_string_length);
  this->m_flags = logFormat->m_flags;
  (this->m_currentUser)._M_dataplus._M_p = (pointer)&(this->m_currentUser).field_2;
  pcVar2 = (logFormat->m_currentUser)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_currentUser,pcVar2,
             pcVar2 + (logFormat->m_currentUser)._M_string_length);
  (this->m_currentHost)._M_dataplus._M_p = (pointer)&(this->m_currentHost).field_2;
  pcVar2 = (logFormat->m_currentHost)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_currentHost,pcVar2,
             pcVar2 + (logFormat->m_currentHost)._M_string_length);
  return;
}

Assistant:

LogFormat::LogFormat(const LogFormat& logFormat):
  m_level(logFormat.m_level),
  m_userFormat(logFormat.m_userFormat),
  m_format(logFormat.m_format),
  m_dateTimeFormat(logFormat.m_dateTimeFormat),
  m_flags(logFormat.m_flags),
  m_currentUser(logFormat.m_currentUser),
  m_currentHost(logFormat.m_currentHost) {
}